

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O3

void synthetic_decycle(stagewise_poly *poly)

{
  vw *pvVar1;
  uint64_t *puVar2;
  ulong uVar3;
  uint32_t *puVar4;
  
  if ((poly->synth_ec).super_example_predict.feature_space[0x86].values._end !=
      (poly->synth_ec).super_example_predict.feature_space[0x86].values._begin) {
    uVar3 = 0;
    do {
      pvVar1 = poly->all;
      puVar4 = &(pvVar1->weights).dense_weights._stride_shift;
      puVar2 = &(pvVar1->weights).dense_weights._weight_mask;
      if ((pvVar1->weights).sparse != false) {
        puVar4 = &(pvVar1->weights).sparse_weights._stride_shift;
        puVar2 = &(pvVar1->weights).sparse_weights._weight_mask;
      }
      poly->depthsbits
      [((*puVar2 & (poly->synth_ec).super_example_predict.feature_space[0x86].indicies._begin[uVar3]
        ) >> ((byte)*puVar4 & 0x3f)) * 2 + 1] =
           poly->depthsbits
           [((*puVar2 &
             (poly->synth_ec).super_example_predict.feature_space[0x86].indicies._begin[uVar3]) >>
            ((byte)*puVar4 & 0x3f)) * 2 + 1] ^ 2;
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)(poly->synth_ec).super_example_predict.feature_space[0x86].values
                                   ._end -
                             (long)(poly->synth_ec).super_example_predict.feature_space[0x86].values
                                   ._begin >> 2));
  }
  return;
}

Assistant:

inline size_t size() const { return _end - _begin; }